

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O3

SquareMatrix<double> __thiscall qclab::qgates::SWAP<double>::matrix(SWAP<double> *this)

{
  undefined8 *puVar1;
  SquareMatrix<double> SVar2;
  
  (this->super_QGate2<double>).super_QObject<double>._vptr_QObject = (_func_int **)0x4;
  puVar1 = (undefined8 *)operator_new__(0x80);
  *(undefined8 **)(this->qubits_)._M_elems = puVar1;
  *puVar1 = 0x3ff0000000000000;
  puVar1[5] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[6] = 0x3ff0000000000000;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0x3ff0000000000000;
  puVar1[0xe] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xf] = 0x3ff0000000000000;
  SVar2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)0x0;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , 1 , 0 ,
                                                  0 , 1 , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
        }